

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  cmMakefile *this_00;
  long *plVar1;
  long lVar2;
  bool bVar3;
  cmake *pcVar4;
  string *psVar5;
  bool bVar6;
  string *ext;
  long lVar7;
  long lVar8;
  string err;
  anon_class_24_3_964a6fe1 findInDir;
  array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
  extsLists;
  string lPath;
  
  if (this->IsGenerated == true) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_(&lPath,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&lPath);
    std::__cxx11::string::~string((string *)&lPath);
    return true;
  }
  if (this->FindFullPathFailed != false) {
    return false;
  }
  this_00 = (this->Location).Makefile;
  cmSourceFileLocation::GetFullPath_abi_cxx11_(&lPath,&this->Location);
  pcVar4 = cmMakefile::GetCMakeInstance(this_00);
  extsLists._M_elems[0] = &pcVar4->SourceFileExtensions;
  pcVar4 = cmMakefile::GetCMakeInstance(this_00);
  extsLists._M_elems[1] = &pcVar4->HeaderFileExtensions;
  findInDir.extsLists = &extsLists;
  findInDir.this = this;
  findInDir.lPath = &lPath;
  if ((this->Location).AmbiguousDirectory == true) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar3 = FindFullPath::anon_class_24_3_964a6fe1::operator()(&findInDir,psVar5);
    bVar6 = true;
    if (bVar3) goto LAB_00154b85;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    bVar3 = FindFullPath::anon_class_24_3_964a6fe1::operator()(&findInDir,psVar5);
  }
  else {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    bVar3 = FindFullPath::anon_class_24_3_964a6fe1::operator()(&findInDir,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  bVar6 = true;
  if (!bVar3) {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&err);
    std::__cxx11::string::append((string *)&err);
    std::__cxx11::string::append((char *)&err);
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 8) {
      plVar1 = *(long **)((long)extsLists._M_elems + lVar8);
      lVar2 = plVar1[1];
      for (lVar7 = *plVar1; lVar7 != lVar2; lVar7 = lVar7 + 0x20) {
        std::__cxx11::string::append((char *)&err);
        std::__cxx11::string::append((string *)&err);
      }
    }
    if (error == (string *)0x0) {
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&err);
    }
    else {
      std::__cxx11::string::operator=((string *)error,(string *)&err);
    }
    this->FindFullPathFailed = true;
    std::__cxx11::string::~string((string *)&err);
    bVar6 = false;
  }
LAB_00154b85:
  std::__cxx11::string::~string((string *)&lPath);
  return bVar6;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If the file is generated compute the location without checking on disk.
  if (this->GetIsGenerated()) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const lPath = this->Location.GetFullPath();
  // List of extension lists
  std::array<std::vector<std::string> const*, 2> const extsLists = {
    { &makefile->GetCMakeInstance()->GetSourceExtensions(),
      &makefile->GetCMakeInstance()->GetHeaderExtensions() }
  };

  // Tries to find the file in a given directory
  auto findInDir = [this, &extsLists, &lPath](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    if (cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // Try full path with extension
    for (auto exts : extsLists) {
      for (std::string const& ext : *exts) {
        if (!ext.empty()) {
          std::string extPath = fullPath;
          extPath += '.';
          extPath += ext;
          if (cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err;
  err += "Cannot find source file:\n  ";
  err += lPath;
  err += "\nTried extensions";
  for (auto exts : extsLists) {
    for (std::string const& ext : *exts) {
      err += " .";
      err += ext;
    }
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}